

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMatrixUtils.cpp
# Opt level: O2

HighsStatus
assessMatrix(HighsLogOptions *log_options,string *matrix_name,HighsInt vec_dim,HighsInt num_vec,
            bool partitioned,vector<int,_std::allocator<int>_> *matrix_start,
            vector<int,_std::allocator<int>_> *matrix_p_end,
            vector<int,_std::allocator<int>_> *matrix_index,
            vector<double,_std::allocator<double>_> *matrix_value,double small_matrix_value,
            double large_matrix_value)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  uint *puVar4;
  pointer piVar5;
  pointer pdVar6;
  HighsStatus HVar7;
  uint uVar8;
  ValueType *pVVar9;
  pointer pcVar10;
  char *pcVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  HighsStatus HVar15;
  ulong uVar16;
  bool bVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  vector<double,_std::allocator<double>_> *pvVar21;
  undefined4 uVar23;
  undefined8 uVar22;
  uint local_b8;
  HighsInt component;
  int local_b0;
  HighsInt local_ac;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  ulong local_80;
  long local_78;
  double local_70;
  ulong local_68;
  long local_60;
  HighsHashTable<int,_void> index_set;
  
  pvVar21 = matrix_value;
  local_ac = vec_dim;
  local_88 = small_matrix_value;
  local_70 = large_matrix_value;
  HVar7 = assessMatrixDimensions
                    (log_options,num_vec,partitioned,matrix_start,matrix_p_end,matrix_index,
                     matrix_value);
  if (HVar7 != kError) {
    piVar3 = (matrix_start->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (*piVar3 == 0) {
      local_78 = (long)num_vec;
      puVar4 = (uint *)(matrix_p_end->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start;
      uVar13 = 0;
      if (partitioned) {
        uVar13 = (ulong)*puVar4;
      }
      iVar14 = piVar3[local_78];
      uVar16 = 0;
      if (0 < num_vec) {
        uVar16 = (ulong)(uint)num_vec;
      }
      uVar8 = 0;
      for (uVar12 = 0; uVar23 = (undefined4)((ulong)pvVar21 >> 0x20), uVar16 != uVar12;
          uVar12 = uVar12 + 1) {
        uVar1 = piVar3[uVar12];
        if ((int)uVar1 < (int)uVar8) {
          pcVar10 = (matrix_name->_M_dataplus)._M_p;
          uVar22 = CONCAT44(uVar23,uVar8);
          pcVar11 = "%s matrix packed vector %d has illegal start of %d < %d = previous start\n";
          uVar13 = (ulong)uVar1;
          goto LAB_0035f2d3;
        }
        if ((partitioned) &&
           (uVar8 = puVar4[uVar12], uVar13 = (ulong)uVar8, (int)uVar8 < (int)uVar1)) {
          pcVar10 = (matrix_name->_M_dataplus)._M_p;
          uVar22 = CONCAT44(uVar23,uVar1);
          pcVar11 = "%s matrix packed vector %d has illegal partition end of %d < %d =  start\n";
          goto LAB_0035f2d3;
        }
        uVar8 = uVar1;
      }
      if (iVar14 < (int)uVar8) {
        pcVar10 = (matrix_name->_M_dataplus)._M_p;
        uVar22 = CONCAT44(uVar23,iVar14);
        pcVar11 = "%s matrix packed vector %d has illegal start of %d > %d = number of nonzeros\n";
        uVar12 = (ulong)(uint)num_vec;
        uVar13 = (ulong)uVar8;
      }
      else {
        if ((!partitioned) || ((int)uVar13 <= iVar14)) {
          HighsHashTable<int,_void>::HighsHashTable(&index_set);
          local_a0 = 0.0;
          iVar14 = 0;
          local_b8 = 0;
          local_b0 = 0;
          local_90 = 0.0;
          local_a8 = INFINITY;
          local_98 = INFINITY;
          uVar13 = 0;
          do {
            if (uVar13 == uVar16) {
              bVar17 = local_b0 != 0;
              if (bVar17) {
                highsLogUser(log_options,kError,
                             "%s matrix packed vector contains %d |values| in [%g, %g] greater than %g\n"
                             ,local_98,local_90,local_70,(matrix_name->_M_dataplus)._M_p);
              }
              HVar15 = kOk;
              if (local_b8 != 0) {
                if (partitioned) {
                  highsLogUser(log_options,kError,
                               "%s matrix packed partitioned vector contains %d |values| in [%g, %g] less than or equal to %g: ignored\n"
                               ,local_a8,local_a0,local_88,(matrix_name->_M_dataplus)._M_p,
                               (ulong)local_b8);
                }
                bVar17 = partitioned || bVar17;
                if (0.0 < local_a0) {
                  highsLogUser(log_options,kWarning,
                               "%s matrix packed vector contains %d |values| in [%g, %g] less than or equal to %g: ignored\n"
                               ,local_a8,local_a0,local_88,(matrix_name->_M_dataplus)._M_p,
                               (ulong)local_b8);
                  HVar15 = kWarning;
                }
              }
              (matrix_start->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start[local_78] = iVar14;
              HVar7 = kError;
              if (!bVar17) {
                HVar7 = HVar15;
              }
LAB_0035f4e5:
              HighsHashTable<int,_void>::~HighsHashTable(&index_set);
              return HVar7;
            }
            piVar5 = (matrix_start->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            iVar2 = piVar5[uVar13];
            local_68 = uVar13 + 1;
            local_60 = (long)piVar5[uVar13 + 1];
            piVar5[uVar13] = iVar14;
            local_80 = uVar13;
            for (uVar12 = (ulong)iVar2; uVar23 = (undefined4)((ulong)pvVar21 >> 0x20),
                (long)uVar12 < local_60; uVar12 = uVar12 + 1) {
              component = (matrix_index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start[uVar12];
              if (component < 0) {
                pcVar11 = "%s matrix packed vector %d, entry %d, is illegal index %d\n";
LAB_0035f4c1:
                highsLogUser(log_options,kError,pcVar11,(matrix_name->_M_dataplus)._M_p,local_80,
                             uVar12 & 0xffffffff,CONCAT44(uVar23,component));
LAB_0035f4e1:
                HVar7 = kError;
                goto LAB_0035f4e5;
              }
              if (local_ac <= component) {
                highsLogUser(log_options,kError,
                             "%s matrix packed vector %d, entry %d, is illegal index %12d >= %d = vector dimension\n"
                             ,(matrix_name->_M_dataplus)._M_p,local_80,uVar12 & 0xffffffff,
                             CONCAT44(uVar23,component),local_ac);
                goto LAB_0035f4e1;
              }
              pVVar9 = HighsHashTable<int,_void>::find(&index_set,&component);
              uVar23 = (undefined4)((ulong)pvVar21 >> 0x20);
              if (pVVar9 != (ValueType *)0x0) {
                pcVar11 = "%s matrix packed vector %d, entry %d, is duplicate index %d\n";
                goto LAB_0035f4c1;
              }
              dVar18 = ABS((matrix_value->super__Vector_base<double,_std::allocator<double>_>).
                           _M_impl.super__Vector_impl_data._M_start[uVar12]);
              if (local_70 <= dVar18) {
                dVar19 = dVar18;
                if (dVar18 <= local_90) {
                  dVar19 = local_90;
                }
                dVar20 = dVar18;
                if (local_98 <= dVar18) {
                  dVar20 = local_98;
                }
                local_b0 = local_b0 + 1;
                local_98 = dVar20;
                local_90 = dVar19;
              }
              if (dVar18 <= local_88) {
                dVar19 = dVar18;
                if (dVar18 <= local_a0) {
                  dVar19 = local_a0;
                }
                if (local_a8 <= dVar18) {
                  dVar18 = local_a8;
                }
                local_b8 = local_b8 + 1;
                local_a8 = dVar18;
                local_a0 = dVar19;
              }
              else {
                HighsHashTable<int,void>::insert<int&>
                          ((HighsHashTable<int,void> *)&index_set,&component);
                piVar5 = (matrix_index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start;
                piVar5[iVar14] = piVar5[uVar12];
                pdVar6 = (matrix_value->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                         .super__Vector_impl_data._M_start;
                pdVar6[iVar14] = pdVar6[uVar12];
                iVar14 = iVar14 + 1;
              }
            }
            HighsHashTable<int,_void>::clear(&index_set);
            uVar13 = local_68;
          } while( true );
        }
        pcVar10 = (matrix_name->_M_dataplus)._M_p;
        uVar22 = CONCAT44(uVar23,iVar14);
        pcVar11 = 
        "%s matrix packed vector %d has illegal partition end of %d > %d = number of nonzeros\n";
        uVar12 = (ulong)(uint)num_vec;
      }
LAB_0035f2d3:
      highsLogUser(log_options,kError,pcVar11,pcVar10,uVar12,uVar13,uVar22);
    }
    else {
      highsLogUser(log_options,kError,"%s matrix start vector begins with %d rather than 0\n",
                   (matrix_name->_M_dataplus)._M_p);
    }
  }
  return kError;
}

Assistant:

HighsStatus assessMatrix(
    const HighsLogOptions& log_options, const std::string matrix_name,
    const HighsInt vec_dim, const HighsInt num_vec, const bool partitioned,
    vector<HighsInt>& matrix_start, vector<HighsInt>& matrix_p_end,
    vector<HighsInt>& matrix_index, vector<double>& matrix_value,
    const double small_matrix_value, const double large_matrix_value) {
  if (assessMatrixDimensions(log_options, num_vec, partitioned, matrix_start,
                             matrix_p_end, matrix_index,
                             matrix_value) == HighsStatus::kError) {
    return HighsStatus::kError;
  }

  bool error_found = false;
  bool warning_found = false;

  const HighsInt num_nz = matrix_start[num_vec];
  // Assess the starts
  //
  // Check whether the first start is zero
  if (matrix_start[0]) {
    highsLogUser(log_options, HighsLogType::kError,
                 "%s matrix start vector begins with %" HIGHSINT_FORMAT
                 " rather than 0\n",
                 matrix_name.c_str(), matrix_start[0]);
    return HighsStatus::kError;
  }
  // Set up previous_start for a fictitious previous empty packed vector
  HighsInt previous_start = matrix_start[0];
  // Set up this_start to be the first start in case num_vec = 0
  HighsInt this_start = matrix_start[0];
  HighsInt this_p_end = 0;
  if (partitioned) this_p_end = matrix_p_end[0];
  for (HighsInt ix = 0; ix < num_vec; ix++) {
    this_start = matrix_start[ix];
    bool this_start_too_small = this_start < previous_start;
    if (this_start_too_small) {
      highsLogUser(log_options, HighsLogType::kError,
                   "%s matrix packed vector %" HIGHSINT_FORMAT
                   " has illegal start of %" HIGHSINT_FORMAT
                   " < %" HIGHSINT_FORMAT
                   " = "
                   "previous start\n",
                   matrix_name.c_str(), ix, this_start, previous_start);
      return HighsStatus::kError;
    }
    if (partitioned) {
      this_p_end = matrix_p_end[ix];
      bool this_p_end_too_small = this_p_end < this_start;
      if (this_p_end_too_small) {
        highsLogUser(log_options, HighsLogType::kError,
                     "%s matrix packed vector %" HIGHSINT_FORMAT
                     " has illegal partition end of %" HIGHSINT_FORMAT
                     " < %" HIGHSINT_FORMAT
                     " = "
                     " start\n",
                     matrix_name.c_str(), ix, this_p_end, this_start);
        return HighsStatus::kError;
      }
    }
    previous_start = this_start;
  }
  bool this_start_too_big = this_start > num_nz;
  if (this_start_too_big) {
    highsLogUser(log_options, HighsLogType::kError,
                 "%s matrix packed vector %" HIGHSINT_FORMAT
                 " has illegal start of %" HIGHSINT_FORMAT
                 " > %" HIGHSINT_FORMAT
                 " = "
                 "number of nonzeros\n",
                 matrix_name.c_str(), num_vec, this_start, num_nz);
    return HighsStatus::kError;
  }
  if (partitioned) {
    bool this_p_end_too_big = this_p_end > num_nz;
    if (this_p_end_too_big) {
      highsLogUser(log_options, HighsLogType::kError,
                   "%s matrix packed vector %" HIGHSINT_FORMAT
                   " has illegal partition end of %" HIGHSINT_FORMAT
                   " > %" HIGHSINT_FORMAT
                   " = "
                   "number of nonzeros\n",
                   matrix_name.c_str(), num_vec, this_p_end, num_nz);
      return HighsStatus::kError;
    }
  }
  // Assess the indices and values
  // Count the number of acceptable indices/values
  HighsInt num_new_nz = 0;
  HighsInt num_small_values = 0;
  double max_small_value = 0;
  double min_small_value = kHighsInf;
  HighsInt num_large_values = 0;
  double max_large_value = 0;
  double min_large_value = kHighsInf;
  // Use index_map to identify duplicates.
  HighsHashTable<HighsInt> index_set;

  for (HighsInt ix = 0; ix < num_vec; ix++) {
    HighsInt from_el = matrix_start[ix];
    HighsInt to_el = matrix_start[ix + 1];
    // Account for any index-value pairs removed so far
    matrix_start[ix] = num_new_nz;
    for (HighsInt el = from_el; el < to_el; el++) {
      // Check the index
      HighsInt component = matrix_index[el];
      // Check that the index is non-negative
      bool legal_component = component >= 0;
      if (!legal_component) {
        highsLogUser(log_options, HighsLogType::kError,
                     "%s matrix packed vector %" HIGHSINT_FORMAT
                     ", entry %" HIGHSINT_FORMAT
                     ", is illegal index %" HIGHSINT_FORMAT "\n",
                     matrix_name.c_str(), ix, el, component);
        return HighsStatus::kError;
      }
      // Check that the index does not exceed the vector dimension
      legal_component = component < vec_dim;
      if (!legal_component) {
        highsLogUser(log_options, HighsLogType::kError,
                     "%s matrix packed vector %" HIGHSINT_FORMAT
                     ", entry %" HIGHSINT_FORMAT
                     ", is illegal index "
                     "%12" HIGHSINT_FORMAT " >= %" HIGHSINT_FORMAT
                     " = vector dimension\n",
                     matrix_name.c_str(), ix, el, component, vec_dim);
        return HighsStatus::kError;
      }
      // Check that the index has not already occurred.
      legal_component = index_set.find(component) == nullptr;
      if (!legal_component) {
        highsLogUser(log_options, HighsLogType::kError,
                     "%s matrix packed vector %" HIGHSINT_FORMAT
                     ", entry %" HIGHSINT_FORMAT
                     ", is duplicate index %" HIGHSINT_FORMAT "\n",
                     matrix_name.c_str(), ix, el, component);
        return HighsStatus::kError;
      }
      // Check the value
      double abs_value = fabs(matrix_value[el]);
      // Check that the value is not too large
      bool large_value = abs_value >= large_matrix_value;
      if (large_value) {
        if (max_large_value < abs_value) max_large_value = abs_value;
        if (min_large_value > abs_value) min_large_value = abs_value;
        num_large_values++;
      }
      bool ok_value = abs_value > small_matrix_value;
      if (!ok_value) {
        if (max_small_value < abs_value) max_small_value = abs_value;
        if (min_small_value > abs_value) min_small_value = abs_value;
        num_small_values++;
      }
      if (ok_value) {
        // Record where the index has occurred
        index_set.insert(component);
        // Shift the index and value of the OK entry to the new
        // position in the index and value vectors, and increment
        // the new number of nonzeros
        matrix_index[num_new_nz] = matrix_index[el];
        matrix_value[num_new_nz] = matrix_value[el];
        num_new_nz++;
      }
    }  // Loop from_el; to_el
    index_set.clear();
  }  // Loop 0; num_vec
  if (num_large_values) {
    highsLogUser(log_options, HighsLogType::kError,
                 "%s matrix packed vector contains %" HIGHSINT_FORMAT
                 " |values| in [%g, %g] greater than %g\n",
                 matrix_name.c_str(), num_large_values, min_large_value,
                 max_large_value, large_matrix_value);
    error_found = true;
  }
  if (num_small_values) {
    if (partitioned) {
      // Shouldn't happen with a partitioned row-wise matrix since its
      // values should be OK and the code above doesn't handle p_end
      highsLogUser(
          log_options, HighsLogType::kError,
          "%s matrix packed partitioned vector contains %" HIGHSINT_FORMAT
          " |values| in [%g, %g] less than or equal to %g: ignored\n",
          matrix_name.c_str(), num_small_values, min_small_value,
          max_small_value, small_matrix_value);
      error_found = true;
      assert(num_small_values == 0);
    }
    // If explicit zeros are ignored, then no model information is
    // lost, so only report and return a warning if small nonzeros are
    // ignored
    if (max_small_value > 0) {
      highsLogUser(log_options, HighsLogType::kWarning,
                   "%s matrix packed vector contains %" HIGHSINT_FORMAT
                   " |values| in [%g, %g] "
                   "less than or equal to %g: ignored\n",
                   matrix_name.c_str(), num_small_values, min_small_value,
                   max_small_value, small_matrix_value);
      warning_found = true;
    }
  }
  matrix_start[num_vec] = num_new_nz;
  HighsStatus return_status = HighsStatus::kOk;
  if (error_found)
    return_status = HighsStatus::kError;
  else if (warning_found)
    return_status = HighsStatus::kWarning;
  return return_status;
}